

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ban.c
# Opt level: O0

bool check_ban(char *usite,int type,int host)

{
  bool bVar1;
  char *pcVar2;
  CRow *pCVar3;
  v9 *this;
  uint in_EDX;
  uint in_ESI;
  char *in_RDI;
  string buffer;
  CRow row;
  int res;
  char site [4608];
  CSQLInterface *in_stack_ffffffffffffec90;
  char local_135c;
  char *local_1340 [2];
  string local_1330 [32];
  CRow local_1310;
  int local_12ec;
  anon_union_16_16_d721ec3a_for_value<fmt::v9::basic_format_context<fmt::v9::appender,_char>_>_1
  local_12e8 [29];
  format_args in_stack_ffffffffffffeef0;
  string_view in_stack_ffffffffffffef00;
  int in_stack_fffffffffffffedc;
  long in_stack_fffffffffffffee0;
  long in_stack_fffffffffffffee8;
  OBJ_DATA *in_stack_fffffffffffffef0;
  CHAR_DATA *in_stack_fffffffffffffef8;
  char *in_stack_ffffffffffffff00;
  bool local_c9;
  format_arg_store<fmt::v9::basic_format_context<fmt::v9::appender,_char>,_char[4608]> *local_c8 [3]
  ;
  undefined8 local_b0;
  format_arg_store<fmt::v9::basic_format_context<fmt::v9::appender,_char>,_char[4608]> **local_a8;
  char *local_a0;
  size_t local_98;
  anon_union_16_16_d721ec3a_for_value<fmt::v9::basic_format_context<fmt::v9::appender,_char>_>_1
  *local_90;
  char *local_88;
  size_t sStack_80;
  string *local_78;
  char *local_70;
  char **local_68;
  char *local_60;
  char **local_58;
  char **local_50;
  char *local_48;
  size_t sStack_40;
  format_arg_store<fmt::v9::basic_format_context<fmt::v9::appender,_char>,_char[4608]> **local_38;
  undefined8 *local_30;
  format_arg_store<fmt::v9::basic_format_context<fmt::v9::appender,_char>,_char[4608]> **local_28;
  undefined8 local_20;
  undefined8 *local_18;
  format_arg_store<fmt::v9::basic_format_context<fmt::v9::appender,_char>,_char[4608]> **local_10;
  char *local_8;
  
  pcVar2 = capitalize(in_RDI);
  strcpy((char *)&local_12e8[0].int_value,pcVar2);
  if (((char)local_12e8[0]._0_1_ < 'A') || ('Z' < (char)local_12e8[0]._0_1_)) {
    local_135c = local_12e8[0].bool_value;
  }
  else {
    local_135c = local_12e8[0].bool_value + ' ';
  }
  local_12e8[0]._0_1_ = local_135c;
  local_12ec = CSQLInterface::Select
                         (&RS.SQL,"site,duration FROM bans WHERE ban_type=%d AND host_type=%d",
                          (ulong)in_ESI,(ulong)in_EDX);
  if (local_12ec == 0) {
LAB_005a48ae:
    local_c9 = false;
  }
  else {
    do {
      bVar1 = CSQLInterface::End(&RS.SQL);
      if (((bVar1 ^ 0xffU) & 1) == 0) goto LAB_005a48ae;
      pCVar3 = CSQLInterface::GetRow(in_stack_ffffffffffffec90);
      local_1310.maxcol = pCVar3->maxcol;
      local_1310.maxrow = pCVar3->maxrow;
      local_1310.rowpos = pCVar3->rowpos;
      local_1310.row = pCVar3->row;
      this = (v9 *)CRow::operator[](&local_1310,0);
      pcVar2 = strstr((char *)&local_12e8[0].int_value,(char *)this);
    } while (pcVar2 == (char *)0x0);
    local_68 = local_1340;
    local_70 = "BANNED - {} just tried to connect.";
    local_60 = "BANNED - {} just tried to connect.";
    local_1340[0] = "BANNED - {} just tried to connect.";
    local_58 = local_68;
    local_98 = std::char_traits<char>::length((char_type *)0x5a46f8);
    local_8 = local_70;
    local_78 = local_1330;
    local_88 = local_1340[0];
    local_90 = local_12e8;
    local_50 = &local_88;
    local_a0 = local_1340[0];
    sStack_80 = local_98;
    local_48 = local_a0;
    sStack_40 = local_98;
    local_c8[0] = fmt::v9::
                  make_format_args<fmt::v9::basic_format_context<fmt::v9::appender,char>,char(&)[4608]>
                            ((format_arg_store<fmt::v9::basic_format_context<fmt::v9::appender,_char>,_char[4608]>
                              *)&local_90->string,this,(char (*) [4608])local_78);
    local_30 = &local_b0;
    local_38 = local_c8;
    local_20 = 0xc;
    local_b0 = 0xc;
    local_28 = local_38;
    local_18 = local_30;
    local_10 = local_38;
    local_a8 = local_38;
    fmt::v9::vformat_abi_cxx11_(in_stack_ffffffffffffef00,in_stack_ffffffffffffeef0);
    std::__cxx11::string::data();
    wiznet(in_stack_ffffffffffffff00,in_stack_fffffffffffffef8,in_stack_fffffffffffffef0,
           in_stack_fffffffffffffee8,in_stack_fffffffffffffee0,in_stack_fffffffffffffedc);
    local_c9 = true;
    std::__cxx11::string::~string(local_1330);
  }
  return local_c9;
}

Assistant:

bool check_ban(char *usite, int type, int host)
{
	char site[MSL];

	strcpy(site, capitalize(usite));
	site[0] = LOWER(site[0]);

	auto res = RS.SQL.Select("site,duration FROM bans WHERE ban_type=%d AND host_type=%d", type, host);
	if (res)
	{
		while (!RS.SQL.End())
		{
			auto row = RS.SQL.GetRow();
			if (strstr(site, row[0]) != nullptr)
			{
				auto buffer = fmt::format("BANNED - {} just tried to connect.", site); //TODO: change the rest of the sprintf calls to format
				wiznet(buffer.data(), nullptr, nullptr, WIZ_LOGINS, 0, 0);
				return true;
			}
		}
	}

	return false;
}